

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::AdamOptimizer::SerializeWithCachedSizes
          (AdamOptimizer *this,CodedOutputStream *output)

{
  if (this->learningrate_ != (DoubleParameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->learningrate_->super_MessageLite,output);
  }
  if (this->minibatchsize_ != (Int64Parameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->minibatchsize_->super_MessageLite,output);
  }
  if (this->beta1_ != (DoubleParameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->beta1_->super_MessageLite,output);
  }
  if (this->beta2_ != (DoubleParameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->beta2_->super_MessageLite,output);
  }
  if (this->eps_ != (DoubleParameter *)0x0 &&
      this != (AdamOptimizer *)&_AdamOptimizer_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&this->eps_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void AdamOptimizer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.AdamOptimizer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.DoubleParameter learningRate = 1;
  if (this->has_learningrate()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->learningrate_, output);
  }

  // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
  if (this->has_minibatchsize()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->minibatchsize_, output);
  }

  // .CoreML.Specification.DoubleParameter beta1 = 3;
  if (this->has_beta1()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->beta1_, output);
  }

  // .CoreML.Specification.DoubleParameter beta2 = 4;
  if (this->has_beta2()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->beta2_, output);
  }

  // .CoreML.Specification.DoubleParameter eps = 5;
  if (this->has_eps()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *this->eps_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.AdamOptimizer)
}